

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scale_common.cc
# Opt level: O0

void ScaleUVRowDown2Linear_C(uint8_t *src_uv,ptrdiff_t src_stride,uint8_t *dst_uv,int dst_width)

{
  int x;
  int dst_width_local;
  uint8_t *dst_uv_local;
  ptrdiff_t src_stride_local;
  uint8_t *src_uv_local;
  
  dst_uv_local = dst_uv;
  src_uv_local = src_uv;
  for (x = 0; x < dst_width; x = x + 1) {
    *dst_uv_local = (uint8_t)((int)((uint)*src_uv_local + (uint)src_uv_local[2] + 1) >> 1);
    dst_uv_local[1] = (uint8_t)((int)((uint)src_uv_local[1] + (uint)src_uv_local[3] + 1) >> 1);
    src_uv_local = src_uv_local + 4;
    dst_uv_local = dst_uv_local + 2;
  }
  return;
}

Assistant:

void ScaleUVRowDown2Linear_C(const uint8_t* src_uv,
                             ptrdiff_t src_stride,
                             uint8_t* dst_uv,
                             int dst_width) {
  int x;
  (void)src_stride;
  for (x = 0; x < dst_width; ++x) {
    dst_uv[0] = (src_uv[0] + src_uv[2] + 1) >> 1;
    dst_uv[1] = (src_uv[1] + src_uv[3] + 1) >> 1;
    src_uv += 4;
    dst_uv += 2;
  }
}